

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O2

char * WTF::itoa_r(intptr_t i,char *buf,size_t sz,int base,size_t padding)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  if (sz == 0) {
    return (char *)0x0;
  }
  if (base - 0x11U < 0xfffffff1) {
LAB_001072fc:
    *buf = '\0';
    buf = (char *)0x0;
  }
  else {
    if (base == 10 && i < 0) {
      if (sz == 1) goto LAB_001072fc;
      i = -i;
      *buf = '-';
      lVar8 = 2;
      pcVar7 = buf + 1;
    }
    else {
      lVar8 = 1;
      pcVar7 = buf;
    }
    uVar5 = (ulong)(uint)base;
    uVar9 = lVar8 + 1;
    pcVar4 = pcVar7 + -1;
    do {
      uVar6 = padding;
      pcVar3 = pcVar4;
      if (sz < uVar9) goto LAB_001072fc;
      uVar2 = (ulong)i / uVar5;
      pcVar3[1] = "0123456789abcdef"[(ulong)i % uVar5];
      pcVar4 = pcVar3 + 1;
      padding = uVar6 - 1;
      if (uVar6 == 0) {
        padding = 0;
      }
      uVar9 = uVar9 + 1;
      bVar10 = uVar5 <= (ulong)i;
      i = uVar2;
    } while ((bVar10) || (1 < uVar6));
    pcVar3[2] = '\0';
    for (; pcVar7 < pcVar4; pcVar7 = pcVar7 + 1) {
      cVar1 = *pcVar4;
      *pcVar4 = *pcVar7;
      *pcVar7 = cVar1;
      pcVar4 = pcVar4 + -1;
    }
  }
  return buf;
}

Assistant:

char *itoa_r(intptr_t i, char *buf, size_t sz, int base, size_t padding) {
  // Make sure we can write at least one NUL byte.
  size_t n = 1;
  if (n > sz)
    return NULL;

  if (base < 2 || base > 16) {
    buf[0] = '\000';
    return NULL;
  }

  char *start = buf;

  uintptr_t j = i;

  // Handle negative numbers (only for base 10).
  if (i < 0 && base == 10) {
    j = -i;

    // Make sure we can write the '-' character.
    if (++n > sz) {
      buf[0] = '\000';
      return NULL;
    }
    *start++ = '-';
  }

  // Loop until we have converted the entire number. Output at least one
  // character (i.e. '0').
  char *ptr = start;
  do {
    // Make sure there is still enough space left in our output buffer.
    if (++n > sz) {
      buf[0] = '\000';
      return NULL;
    }

    // Output the next digit.
    *ptr++ = "0123456789abcdef"[j % base];
    j /= base;

    if (padding > 0)
      padding--;
  } while (j > 0 || padding > 0);

  // Terminate the output with a NUL character.
  *ptr = '\000';

  // Conversion to ASCII actually resulted in the digits being in reverse
  // order. We can't easily generate them in forward order, as we can't tell
  // the number of characters needed until we are done converting.
  // So, now, we reverse the string (except for the possible "-" sign).
  while (--ptr > start) {
    char ch = *ptr;
    *ptr = *start;
    *start++ = ch;
  }
  return buf;
}